

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall CaDiCaL::Internal::error_message_start(Internal *this)

{
  undefined8 in_RDI;
  undefined1 bright;
  
  bright = (undefined1)((ulong)in_RDI >> 0x38);
  fflush(_stdout);
  Terminal::bold((Terminal *)0xdd2180);
  fputs("cadical: ",_stderr);
  Terminal::red((Terminal *)this,(bool)bright);
  fputs("error:",_stderr);
  Terminal::normal((Terminal *)0xdd21c9);
  fputc(0x20,_stderr);
  return;
}

Assistant:

void Internal::error_message_start () {
  fflush (stdout);
  terr.bold ();
  fputs ("cadical: ", stderr);
  terr.red (1);
  fputs ("error:", stderr);
  terr.normal ();
  fputc (' ', stderr);
}